

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Encode.cpp
# Opt level: O2

void idx2::Init(encode_data *E,allocator *Alloc)

{
  Mallocator();
  Init<unsigned_long,idx2::brick_volume>(&E->BrickPool,9,&Mallocator::Instance.super_allocator);
  Mallocator();
  Init<unsigned_int,idx2::channel>(&E->Channels,10,&Mallocator::Instance.super_allocator);
  Mallocator();
  Init<unsigned_long,idx2::sub_channel>(&E->SubChannels,5,&Mallocator::Instance.super_allocator);
  if (Alloc == (allocator *)0x0) {
    Alloc = (allocator *)BrickAlloc_;
  }
  E->Alloc = Alloc;
  Mallocator();
  Init<unsigned_long,idx2::chunk_meta_info>(&E->ChunkMeta,8,&Mallocator::Instance.super_allocator);
  Mallocator();
  Init<unsigned_long,idx2::chunk_exp_info>
            (&E->ChunkExponents,5,&Mallocator::Instance.super_allocator);
  Mallocator();
  (**(code **)Mallocator::Instance.super_allocator._vptr_allocator)
            (&Mallocator::Instance,&E->CompressedChunkAddresses,0x4008);
  (E->CompressedChunkAddresses).BitPtr = (E->CompressedChunkAddresses).Stream.Data;
  (E->CompressedChunkAddresses).BitPos = 0;
  (E->CompressedChunkAddresses).BitBuf = 0;
  Mallocator();
  (**(code **)Mallocator::Instance.super_allocator._vptr_allocator)
            (&Mallocator::Instance,&E->ChunkStream,0x4008);
  (E->ChunkStream).BitPtr = (E->ChunkStream).Stream.Data;
  (E->ChunkStream).BitPos = 0;
  (E->ChunkStream).BitBuf = 0;
  Mallocator();
  (**(code **)Mallocator::Instance.super_allocator._vptr_allocator)
            (&Mallocator::Instance,&E->ChunkExpStream,0x8008);
  (E->ChunkExpStream).BitPtr = (E->ChunkExpStream).Stream.Data;
  (E->ChunkExpStream).BitPos = 0;
  (E->ChunkExpStream).BitBuf = 0;
  return;
}

Assistant:

void
Init(encode_data* E, allocator* Alloc)
{
  Init(&E->BrickPool, 9);
  Init(&E->Channels, 10);
  Init(&E->SubChannels, 5);
  E->Alloc = Alloc ? Alloc : &BrickAlloc_;
  Init(&E->ChunkMeta, 8);
  Init(&E->ChunkExponents, 5);
  //InitWrite(&E->CompressedExps, 32768);
  InitWrite(&E->CompressedChunkAddresses, 16384);
  InitWrite(&E->ChunkStream, 16384);
  InitWrite(&E->ChunkExpStream, 32768);
}